

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecClass.c
# Opt level: O0

void Cec_ManSimProcessRefined(Cec_ManSim_t *p,Vec_Int_t *vRefined)

{
  Gia_Man_t *p_00;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  void *__ptr;
  uint *p_01;
  int local_34;
  int Key;
  int k;
  int i;
  int nTableSize;
  int *pTable;
  uint *pSim;
  Vec_Int_t *vRefined_local;
  Cec_ManSim_t *p_local;
  
  iVar1 = Vec_IntSize(vRefined);
  if (iVar1 != 0) {
    iVar1 = Vec_IntSize(vRefined);
    iVar1 = Abc_PrimeCudd(iVar1 / 3 + 100);
    __ptr = calloc((long)iVar1,4);
    for (local_34 = 0; iVar2 = Vec_IntSize(vRefined), local_34 < iVar2; local_34 = local_34 + 1) {
      iVar2 = Vec_IntEntry(vRefined,local_34);
      p_01 = Cec_ObjSim(p,iVar2);
      iVar3 = Cec_ManSimCompareConst(p_01,p->nWords);
      if (iVar3 != 0) {
        __assert_fail("!Cec_ManSimCompareConst( pSim, p->nWords )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecClass.c"
                      ,0x1de,"void Cec_ManSimProcessRefined(Cec_ManSim_t *, Vec_Int_t *)");
      }
      iVar3 = Cec_ManSimHashKey(p_01,p->nWords,iVar1);
      if (*(int *)((long)__ptr + (long)iVar3 * 4) == 0) {
        iVar4 = Gia_ObjRepr(p->pAig,iVar2);
        if (iVar4 != 0) {
          __assert_fail("Gia_ObjRepr(p->pAig, i) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecClass.c"
                        ,0x1e2,"void Cec_ManSimProcessRefined(Cec_ManSim_t *, Vec_Int_t *)");
        }
        iVar4 = Gia_ObjNext(p->pAig,iVar2);
        if (iVar4 != 0) {
          __assert_fail("Gia_ObjNext(p->pAig, i) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecClass.c"
                        ,0x1e3,"void Cec_ManSimProcessRefined(Cec_ManSim_t *, Vec_Int_t *)");
        }
        Gia_ObjSetRepr(p->pAig,iVar2,0xfffffff);
      }
      else {
        Gia_ObjSetNext(p->pAig,*(int *)((long)__ptr + (long)iVar3 * 4),iVar2);
        p_00 = p->pAig;
        iVar4 = Gia_ObjRepr(p->pAig,*(int *)((long)__ptr + (long)iVar3 * 4));
        Gia_ObjSetRepr(p_00,iVar2,iVar4);
        iVar4 = Gia_ObjRepr(p->pAig,iVar2);
        if (iVar4 == 0xfffffff) {
          Gia_ObjSetRepr(p->pAig,iVar2,*(int *)((long)__ptr + (long)iVar3 * 4));
        }
        iVar4 = Gia_ObjRepr(p->pAig,iVar2);
        if (iVar4 < 1) {
          __assert_fail("Gia_ObjRepr(p->pAig, i) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecClass.c"
                        ,0x1ec,"void Cec_ManSimProcessRefined(Cec_ManSim_t *, Vec_Int_t *)");
        }
      }
      *(int *)((long)__ptr + (long)iVar3 * 4) = iVar2;
    }
    for (local_34 = 0; iVar1 = Vec_IntSize(vRefined), local_34 < iVar1; local_34 = local_34 + 1) {
      iVar1 = Vec_IntEntry(vRefined,local_34);
      iVar2 = Gia_ObjIsHead(p->pAig,iVar1);
      if (iVar2 != 0) {
        Cec_ManSimClassRefineOne(p,iVar1);
      }
    }
    for (local_34 = 0; iVar1 = Vec_IntSize(vRefined), local_34 < iVar1; local_34 = local_34 + 1) {
      iVar1 = Vec_IntEntry(vRefined,local_34);
      Cec_ManSimSimDeref(p,iVar1);
    }
    if (__ptr != (void *)0x0) {
      free(__ptr);
    }
  }
  return;
}

Assistant:

void Cec_ManSimProcessRefined( Cec_ManSim_t * p, Vec_Int_t * vRefined )
{
    unsigned * pSim;
    int * pTable, nTableSize, i, k, Key;
    if ( Vec_IntSize(vRefined) == 0 )
        return;
    nTableSize = Abc_PrimeCudd( 100 + Vec_IntSize(vRefined) / 3 );
    pTable = ABC_CALLOC( int, nTableSize );
    Vec_IntForEachEntry( vRefined, i, k )
    {
        pSim = Cec_ObjSim( p, i );
        assert( !Cec_ManSimCompareConst( pSim, p->nWords ) );
        Key = Cec_ManSimHashKey( pSim, p->nWords, nTableSize );
        if ( pTable[Key] == 0 )
        {
            assert( Gia_ObjRepr(p->pAig, i) == 0 );
            assert( Gia_ObjNext(p->pAig, i) == 0 );
            Gia_ObjSetRepr( p->pAig, i, GIA_VOID );
        }
        else
        {
            Gia_ObjSetNext( p->pAig, pTable[Key], i );
            Gia_ObjSetRepr( p->pAig, i, Gia_ObjRepr(p->pAig, pTable[Key]) );
            if ( Gia_ObjRepr(p->pAig, i) == GIA_VOID )
                Gia_ObjSetRepr( p->pAig, i, pTable[Key] );
            assert( Gia_ObjRepr(p->pAig, i) > 0 );
        }
        pTable[Key] = i;
    }
    Vec_IntForEachEntry( vRefined, i, k )
    {
        if ( Gia_ObjIsHead( p->pAig, i ) )
            Cec_ManSimClassRefineOne( p, i );
    }
    Vec_IntForEachEntry( vRefined, i, k )
        Cec_ManSimSimDeref( p, i );
    ABC_FREE( pTable );
}